

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGStreamPostalService.h
# Opt level: O1

bool __thiscall VCGStreamPostalService::StartService(VCGStreamPostalService *this)

{
  atomic_count *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  impl_type *piVar4;
  undefined1 auVar5 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  work *__tmp;
  scoped_lock Lock;
  undefined1 local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  _Head_base<0UL,_VCGStreamPostalService_*,_false> local_38;
  unique_lock<boost::mutex> local_30;
  thread local_20;
  
  local_30.is_locked = false;
  local_30.m = &this->m_Mutex;
  boost::unique_lock<boost::mutex>::lock(&local_30);
  if ((this->m_pService).super___shared_ptr<boost::asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    local_48 = (undefined1  [8])0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<boost::asio::io_context,std::allocator<boost::asio::io_context>>
              (&_Stack_40,(io_context **)local_48,(allocator<boost::asio::io_context> *)&local_20);
    _Var6._M_pi = _Stack_40._M_pi;
    auVar5 = local_48;
    local_48 = (undefined1  [8])0x0;
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = (this->m_pService).
             super___shared_ptr<boost::asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->m_pService).super___shared_ptr<boost::asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)auVar5;
    (this->m_pService).super___shared_ptr<boost::asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var6._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
    }
  }
  if ((this->m_pWork).super___shared_ptr<boost::asio::io_context::work,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    peVar3 = (this->m_pService).
             super___shared_ptr<boost::asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
    p_Var7->_M_use_count = 1;
    p_Var7->_M_weak_count = 1;
    p_Var7->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001a1fb0;
    piVar4 = peVar3->impl_;
    p_Var7[1]._vptr__Sp_counted_base = (_func_int **)piVar4;
    LOCK();
    paVar1 = &piVar4->outstanding_work_;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
    (this->m_pWork).super___shared_ptr<boost::asio::io_context::work,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)(p_Var7 + 1);
    p_Var2 = (this->m_pWork).
             super___shared_ptr<boost::asio::io_context::work,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->m_pWork).super___shared_ptr<boost::asio::io_context::work,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var7;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    local_48 = (undefined1  [8])ThreadFunction;
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_38._M_head_impl = this;
    boost::thread::thread<std::_Bind<void(VCGStreamPostalService::*(VCGStreamPostalService*))()>>
              (&local_20,
               (_Bind<void_(VCGStreamPostalService::*(VCGStreamPostalService_*))()> *)local_48);
    boost::thread::operator=(&this->m_Thread,&local_20);
    boost::thread::~thread(&local_20);
  }
  if (local_30.is_locked == true) {
    boost::mutex::unlock(local_30.m);
  }
  return true;
}

Assistant:

bool StartService()
  {
    boost::mutex::scoped_lock Lock( m_Mutex );
    if( !m_pService )
    {
      m_pService = std::make_shared< boost::asio::io_service >();
    }

    if( !m_pWork )
    {
      m_pWork = std::make_shared< boost::asio::io_service::work >( *m_pService );
      m_Thread = boost::thread( std::bind( &VCGStreamPostalService::ThreadFunction, this ) );
    }

    return true;
  }